

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# have_sys_socket.c
# Opt level: O3

int sys_socket_sendto_udp_target(network_target *target,char *msg,size_t msg_size)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  
  lock_network_target(target);
  sVar2 = send(target->handle,msg,msg_size,0x4000);
  unlock_network_target(target);
  iVar1 = 1;
  if (sVar2 == -1) {
    piVar3 = __errno_location();
    raise_socket_send_failure
              ("send failed with a sys/socket.h socket",*piVar3,"errno after the failed call");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
sys_socket_sendto_udp_target( const struct network_target *target,
                              const char *msg,
                              size_t msg_size ) {
  ssize_t send_result;

  lock_network_target( target );
  send_result = send( target->handle,
                      msg,
                      msg_size,
                      config_disallow_signal_during_sending_flag );

  if( unlikely( send_result == -1 ) ){
    unlock_network_target( target );
    raise_socket_send_failure( L10N_SEND_SYS_SOCKET_FAILED_ERROR_MESSAGE,
                               errno,
                               L10N_ERRNO_ERROR_CODE_TYPE );
    return -1;
  }

  unlock_network_target( target );

  return 1;
}